

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void __thiscall
Logger::write_log(Logger *this,char *file_name,char *tn_callbackname,int line_no,log_level level,
                 char *format,...)

{
  bool bVar1;
  mutex_type *pmVar2;
  long lVar3;
  FILE *pFVar4;
  char *__s;
  my_time mVar5;
  undefined8 in_stack_fffffffffffffcc8;
  undefined4 uVar6;
  byte local_2fa;
  lock_guard<std::mutex> local_230;
  lock_guard<std::mutex> lck_2;
  int m;
  int n;
  lock_guard<std::mutex> lck_1;
  string log_str;
  va_list valst;
  char local_1d8 [8];
  char prefix [24];
  char local_1b8 [8];
  char new_file_name [301];
  lock_guard<std::mutex> local_70;
  lock_guard<std::mutex> lck;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  my_time my_tm;
  char *format_local;
  log_level level_local;
  int line_no_local;
  char *tn_callbackname_local;
  char *file_name_local;
  Logger *this_local;
  
  uVar6 = (undefined4)((ulong)in_stack_fffffffffffffcc8 >> 0x20);
  mVar5 = get_current_sys_time();
  pmVar2 = mVar5._0_8_;
  lck._M_device = pmVar2;
  std::lock_guard<std::mutex>::lock_guard(&local_70,&this->l_mutex);
  this->l_count = this->l_count + 1;
  cStack_4f = mVar5.day;
  cStack_50 = mVar5.month;
  if ((this->l_today != (int)cStack_4f) || (this->l_count % (long)this->l_split_lines == 0)) {
    if (2 < pr_level) {
      printf("[%-5s][%s:%d] start to create a new log file\n","debug","write_log",0xa3);
    }
    memset(local_1b8,0,0x12d);
    fflush((FILE *)this->l_fp);
    fclose((FILE *)this->l_fp);
    memset(local_1d8,0,0x18);
    snprintf(local_1d8,0x17,"%04d_%02d_%02d_",(ulong)pmVar2 & 0xffffffff,(ulong)(uint)(int)cStack_50
             ,(ulong)(uint)(int)cStack_4f);
    if (this->l_today == (int)cStack_4f) {
      lVar3 = this->l_count / (long)this->l_split_lines;
      snprintf(local_1b8,300,"%s%s%s.%lld",this,local_1d8,this->l_file_name,lVar3);
      uVar6 = (undefined4)((ulong)lVar3 >> 0x20);
    }
    else {
      snprintf(local_1b8,300,"%s%s%s",this,local_1d8,this->l_file_name);
      this->l_today = (int)cStack_4f;
      this->l_count = 0;
    }
    pFVar4 = fopen(local_1b8,"a");
    this->l_fp = (FILE *)pFVar4;
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_70);
  log_str.field_2._12_4_ = 0x30;
  log_str.field_2._8_4_ = 0x30;
  std::__cxx11::string::string((string *)&lck_1);
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&m,&this->l_mutex);
  cStack_4e = mVar5.hour;
  cStack_4d = mVar5.minute;
  lck_2._M_device._4_4_ =
       snprintf(this->l_buf,300,"%04d-%02d-%02d %02d:%02d:%02d %s [%s:%s:%d] ",
                (ulong)pmVar2 & 0xffffffff,(ulong)(uint)(int)cStack_50,(ulong)(uint)(int)cStack_4f,
                CONCAT44(uVar6,(int)cStack_4e),(int)cStack_4d,(int)mVar5.second,LogLevelName[level],
                file_name,tn_callbackname,line_no);
  lck_2._M_device._0_4_ =
       vsnprintf(this->l_buf + lck_2._M_device._4_4_,(long)(this->l_buf_size + -1),format,
                 (__gnuc_va_list)((long)&log_str.field_2 + 8));
  this->l_buf[lck_2._M_device._4_4_ + (int)lck_2._M_device] = '\n';
  this->l_buf[(long)(lck_2._M_device._4_4_ + (int)lck_2._M_device) + 1] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lck_1,this->l_buf
            );
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&m);
  if ((this->l_is_async & 1U) == 0) {
    std::lock_guard<std::mutex>::lock_guard(&local_230,&this->l_mutex);
    __s = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lck_1);
    fputs(__s,(FILE *)this->l_fp);
    std::lock_guard<std::mutex>::~lock_guard(&local_230);
  }
  else {
    do {
      bVar1 = buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::push(this->l_buffer_queue,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lck_1);
      local_2fa = 0;
      if (!bVar1) {
        bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->is_thread_stop);
        local_2fa = bVar1 ^ 0xff;
      }
    } while ((local_2fa & 1) != 0);
  }
  std::__cxx11::string::~string((string *)&lck_1);
  return;
}

Assistant:

void Logger::write_log(const char* file_name, const char* tn_callbackname, int line_no, log_level level, const char *format, ...)
{
    my_time my_tm = get_current_sys_time();

    {
        lock_guard<mutex> lck (l_mutex);
        l_count++;

        if (l_today != my_tm.day || l_count % l_split_lines == 0)
        {
            PR_DEBUG("start to create a new log file\n");
            char new_file_name[301] = {0};
            fflush(l_fp);
            fclose(l_fp);
            char prefix[24] = {0};
        
            snprintf(prefix, 23, "%04d_%02d_%02d_", my_tm.year, my_tm.month, my_tm.day);
        
            if (l_today != my_tm.day)
            {
                snprintf(new_file_name, 300, "%s%s%s", l_dir_name, prefix, l_file_name);
                l_today = my_tm.day;
                l_count = 0;
            }
            else
            {
                snprintf(new_file_name, 300, "%s%s%s.%lld", l_dir_name, prefix, l_file_name, l_count / l_split_lines);
            }
            l_fp = fopen(new_file_name, "a");
        }
    }

    va_list valst;
    va_start(valst, format);

    string log_str;
    {
        lock_guard<mutex> lck (l_mutex);;

        int n = snprintf(l_buf, 300, "%04d-%02d-%02d %02d:%02d:%02d %s [%s:%s:%d] ",
                        my_tm.year, my_tm.month, my_tm.day,
                            my_tm.hour, my_tm.minute, my_tm.second, LogLevelName[level],
                            file_name, tn_callbackname, line_no);
        
        int m = vsnprintf(l_buf + n, l_buf_size - 1, format, valst);
        l_buf[n + m] = '\n';
        l_buf[n + m + 1] = '\0';
        log_str = l_buf;
    }
    va_end(valst);
    

    if (l_is_async)
    {
        while (!l_buffer_queue->push(log_str) && !is_thread_stop)   //FIXME: use tm_condvar replacing busy loop
        {               
        }
        
    }
    else
    {
        lock_guard<mutex> lck (l_mutex);
        fputs(log_str.c_str(), l_fp);   
    }
}